

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_pkt_generator.c
# Opt level: O1

void rfc5444_writer_flush(rfc5444_writer *writer,rfc5444_writer_target *target,_Bool force)

{
  byte *pbVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  uint8_t *puVar6;
  long lVar7;
  ulong uVar8;
  list_entity *plVar9;
  bool bVar10;
  size_t total;
  size_t local_30;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x77,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if (target->sendPacket ==
      (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr_void_ptr_size_t *)0x0) {
    __assert_fail("target->sendPacket",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_pkt_generator.c"
                  ,0x7a,
                  "void rfc5444_writer_flush(struct rfc5444_writer *, struct rfc5444_writer_target *, _Bool)"
                 );
  }
  if (target->_is_flushed == true) {
    if (!force) {
      return;
    }
    _rfc5444_writer_begin_packet(writer,target);
  }
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
  for (plVar9 = (writer->_pkthandlers).prev; plVar9->next != (writer->_pkthandlers).next;
      plVar9 = plVar9->prev) {
    if (plVar9[1].prev != (list_entity *)0x0) {
      (*(code *)plVar9[1].prev)(writer,target);
    }
  }
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
  if (target->finishPacketHeader != (_func_void_rfc5444_writer_ptr_rfc5444_writer_target_ptr *)0x0)
  {
    (*target->finishPacketHeader)(writer,target);
  }
  puVar6 = (target->_pkt).buffer;
  *puVar6 = '\0';
  if (target->_has_seqno == true) {
    pbVar1 = (target->_pkt).buffer;
    *pbVar1 = *pbVar1 | 8;
    puVar6[1] = *(uint8_t *)((long)&target->_seqno + 1);
    puVar6[2] = (uint8_t)target->_seqno;
    puVar6 = puVar6 + 3;
  }
  else {
    puVar6 = puVar6 + 1;
  }
  lVar7 = (target->_pkt).set + (target->_pkt).added;
  if (lVar7 != 0) {
    pbVar1 = (target->_pkt).buffer;
    *pbVar1 = *pbVar1 | 4;
    *puVar6 = (uint8_t)((ulong)lVar7 >> 8);
    puVar6[1] = (uint8_t)lVar7;
  }
  uVar8 = (ulong)((uint)target->_has_seqno * 2);
  sVar2 = (target->_pkt).added;
  sVar3 = (target->_pkt).set;
  lVar7 = uVar8 + 3;
  if (sVar2 + sVar3 == 0) {
    lVar7 = uVar8 + 1;
  }
  if (target->_bin_msgs_size != 0) {
    puVar6 = (target->_pkt).buffer;
    memmove(puVar6 + lVar7 + sVar2 + sVar3,
            puVar6 + (target->_pkt).allocated + sVar2 + (target->_pkt).header,target->_bin_msgs_size
           );
  }
  local_30 = lVar7 + (target->_pkt).added + (target->_pkt).set + target->_bin_msgs_size;
  plVar9 = (writer->_processors).list_head.next;
  bVar10 = plVar9->prev == (writer->_processors).list_head.prev;
  if (!bVar10) {
    do {
      cVar4 = (*(code *)plVar9[4].next)(plVar9,0xffffffff);
      if ((cVar4 != '\0') &&
         (iVar5 = (*(code *)plVar9[4].prev)(plVar9,target,0,(target->_pkt).buffer,&local_30),
         iVar5 != 0)) break;
      plVar9 = plVar9->next;
      bVar10 = plVar9->prev == (writer->_processors).list_head.prev;
    } while (!bVar10);
  }
  if ((bool)(local_30 != 0 & bVar10)) {
    (*target->sendPacket)(writer,target,(target->_pkt).buffer,local_30);
  }
  (target->_pkt).set = 0;
  target->_bin_msgs_size = 0;
  target->_is_flushed = true;
  writer->_state = RFC5444_WRITER_NONE;
  return;
}

Assistant:

void
rfc5444_writer_flush(struct rfc5444_writer *writer, struct rfc5444_writer_target *target, bool force) {
  struct rfc5444_writer_postprocessor *processor;
  struct rfc5444_writer_pkthandler *handler;
  size_t len, total;
  bool error;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  assert(target->sendPacket);

  if (target->_is_flushed) {
    if (!force) {
      return;
    }

    /* begin a new packet, buffer is flushed at the moment */
    _rfc5444_writer_begin_packet(writer, target);
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTTLV;
#endif

  /* finalize packet tlvs */
  list_for_each_element_reverse(&writer->_pkthandlers, handler, _pkthandle_node) {
    if (handler->finishPacketTLVs) {
      handler->finishPacketTLVs(writer, target);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_FINISH_PKTHEADER;
#endif
  /* finalize packet header */
  if (target->finishPacketHeader) {
    target->finishPacketHeader(writer, target);
  }

  /* write packet header (including tlvblock length if necessary */
  _write_pktheader(target);

  /* calculate true length of header (optional tlv block !) */
  len = 1;
  if (target->_has_seqno) {
    len += 2;
  }
  if (target->_pkt.added + target->_pkt.set > 0) {
    len += 2;
  }

  /* compress packet buffer */
  if (target->_bin_msgs_size) {
    memmove(&target->_pkt.buffer[len + target->_pkt.added + target->_pkt.set],
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated], target->_bin_msgs_size);
  }

  /* run post-processors */
  error = false;
  total = len + target->_pkt.added + target->_pkt.set + target->_bin_msgs_size;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, RFC5444_WRITER_PKT_POSTPROCESSOR)) {
      if (processor->process(processor, target, NULL, &target->_pkt.buffer[0], &total)) {
        /* error, stop postprocessing and drop message */
        error = true;
        break;
      }
    }
  }

  if (!error && total > 0) {
    /* send packet */
    target->sendPacket(writer, target, target->_pkt.buffer, total);
  }

  /* cleanup length information */
  target->_pkt.set = 0;
  target->_bin_msgs_size = 0;

  /* mark buffer as flushed */
  target->_is_flushed = true;

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif

#if DEBUG_CLEANUP == true
  memset(target->_pkt.buffer, 252, target->_pkt.max);
#endif
}